

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_priority_deque.cpp
# Opt level: O3

bool (anonymous_namespace)::
     have_same_elements<boost::container::priority_deque<int,std::vector<int,std::allocator<int>>,std::less<int>>,int>
               (priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> *values
               ,multiset<int,_std::less<int>,_std::allocator<int>_> *rf)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  const_iterator __position;
  int *piVar4;
  
  piVar4 = (values->sequence_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar4 != (values->sequence_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    p_Var1 = &(rf->_M_t)._M_impl.super__Rb_tree_header;
    do {
      p_Var3 = (rf->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var3 == (_Base_ptr)0x0) {
        return false;
      }
      iVar2 = *piVar4;
      __position._M_node = &p_Var1->_M_header;
      do {
        if (iVar2 <= (int)p_Var3[1]._M_color) {
          __position._M_node = p_Var3;
        }
        p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < iVar2];
      } while (p_Var3 != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)__position._M_node == p_Var1) {
        return false;
      }
      if (iVar2 < (int)__position._M_node[1]._M_color) {
        return false;
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      erase_abi_cxx11_((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       rf,__position);
      piVar4 = piVar4 + 1;
    } while (piVar4 != (values->sequence_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  return (rf->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0;
}

Assistant:

bool have_same_elements(T const & values, std::multiset<T2> rf)
{
  typedef typename T::const_iterator itr_t;
  for (itr_t it = values.begin(); it != values.end(); ++it)
  {
    typedef typename std::multiset<T2>::iterator set_itr_t;
    set_itr_t set_it = rf.find(*it);
    if (set_it == rf.end())
      return false;
    else
      rf.erase(set_it);
  }
  return rf.empty();
}